

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void * operator_new__(size_t size)

{
  int byte_size;
  ThreadCache *this;
  undefined8 *puVar1;
  bool bVar2;
  void *pvVar3;
  FreeList *pFVar4;
  uint in_EDX;
  uint cl;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if ((base::internal::new_hooks_ != 0) ||
     (this = (ThreadCache *)*in_FS_OFFSET, this == (ThreadCache *)0x0)) goto LAB_0010e649;
  if (size < 0x401) {
    in_EDX = (int)size + 7U >> 3;
LAB_0010e5ed:
    bVar2 = true;
  }
  else {
    if (size < 0x40001) {
      in_EDX = (int)size + 0x3c7fU >> 7;
      goto LAB_0010e5ed;
    }
    bVar2 = false;
  }
  if (bVar2) {
    cl = (uint)(byte)(&tcmalloc::Static::sizemap_)[in_EDX];
    byte_size = this->list_[cl].size_;
    puVar1 = (undefined8 *)this->list_[cl].list_;
    if (puVar1 != (undefined8 *)0x0) {
      pFVar4 = this->list_ + cl;
      pFVar4->list_ = (void *)*puVar1;
      uVar5 = pFVar4->length_ - 1;
      pFVar4->length_ = uVar5;
      if (uVar5 < pFVar4->lowater_) {
        pFVar4->lowater_ = uVar5;
      }
      if (puVar1 != (undefined8 *)0x0) {
        this->size_ = this->size_ - byte_size;
        return puVar1;
      }
    }
    pvVar3 = tcmalloc::ThreadCache::FetchFromCentralCache(this,cl,byte_size,tcmalloc::cpp_throw_oom)
    ;
    return pvVar3;
  }
LAB_0010e649:
  pvVar3 = tcmalloc::allocate_full_cpp_throw_oom(size);
  return pvVar3;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new(size_t size) {
  return malloc_fast_path<tcmalloc::cpp_throw_oom>(size);
}